

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_start_twice(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uint64_t uVar4;
  uv_loop_t *unaff_RBX;
  undefined8 *puVar5;
  code **ppcVar6;
  uv_timer_t *puVar7;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t once;
  uv_timer_t uStack_400;
  uv_loop_t *puStack_388;
  code *pcStack_380;
  void *pvStack_378;
  undefined1 auStack_370 [16];
  undefined8 uStack_360;
  uv__queue *puStack_358;
  undefined1 auStack_350 [24];
  uv_close_cb p_Stack_338;
  uv_loop_t *puStack_330;
  undefined8 uStack_320;
  undefined1 auStack_318 [8];
  uv_timer_t uStack_310;
  uv_loop_t *puStack_298;
  uv__queue *puStack_288;
  uv__queue *puStack_280;
  undefined1 auStack_270 [8];
  code *pcStack_268;
  undefined8 auStack_260 [2];
  undefined1 auStack_250 [8];
  uv_timer_t uStack_248;
  uv_timer_t uStack_1d0;
  uv_loop_t *puStack_158;
  uv_timer_t uStack_130;
  uv_loop_t *puStack_b8;
  uv_loop_t *puStack_b0;
  uv__queue *puStack_a8;
  uv_loop_t *puStack_a0;
  uv_handle_t *local_90;
  undefined1 local_88 [128];
  
  puStack_a0 = (uv_loop_t *)0x1d2e3c;
  puVar2 = uv_default_loop();
  puStack_a0 = (uv_loop_t *)0x1d2e49;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(local_88 + 8));
  local_88._0_8_ = SEXT48(iVar1);
  local_90 = (uv_handle_t *)0x0;
  if ((uv_handle_t *)local_88._0_8_ == (uv_handle_t *)0x0) {
    puStack_a0 = (uv_loop_t *)0x1d2e81;
    iVar1 = uv_timer_start((uv_timer_t *)(local_88 + 8),never_cb,86400000,0);
    local_88._0_8_ = SEXT48(iVar1);
    local_90 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_88._0_8_ != (uv_handle_t *)0x0) goto LAB_001d2f98;
    puStack_a0 = (uv_loop_t *)0x1d2eb9;
    iVar1 = uv_timer_start((uv_timer_t *)(local_88 + 8),twice_cb,10,0);
    local_88._0_8_ = SEXT48(iVar1);
    local_90 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_88._0_8_ != (uv_handle_t *)0x0) goto LAB_001d2fa7;
    puStack_a0 = (uv_loop_t *)0x1d2ede;
    puVar2 = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d2ee8;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_88._0_8_ = SEXT48(iVar1);
    local_90 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_88._0_8_ != (uv_handle_t *)0x0) goto LAB_001d2fb6;
    local_88._0_8_ = (uv_handle_t *)0x1;
    local_90 = (uv_handle_t *)(long)twice_cb_called;
    if (local_90 != (uv_handle_t *)0x1) goto LAB_001d2fc5;
    puStack_a0 = (uv_loop_t *)0x1d2f32;
    unaff_RBX = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d2f46;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_a0 = (uv_loop_t *)0x1d2f50;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_88._0_8_ = (uv_handle_t *)0x0;
    puStack_a0 = (uv_loop_t *)0x1d2f5e;
    puVar2 = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d2f66;
    iVar1 = uv_loop_close(puVar2);
    local_90 = (uv_handle_t *)(long)iVar1;
    if ((uv_handle_t *)local_88._0_8_ == local_90) {
      puStack_a0 = (uv_loop_t *)0x1d2f7e;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1d2f98;
    run_test_timer_start_twice_cold_1();
LAB_001d2f98:
    puStack_a0 = (uv_loop_t *)0x1d2fa7;
    run_test_timer_start_twice_cold_2();
LAB_001d2fa7:
    puStack_a0 = (uv_loop_t *)0x1d2fb6;
    run_test_timer_start_twice_cold_3();
LAB_001d2fb6:
    puStack_a0 = (uv_loop_t *)0x1d2fc5;
    run_test_timer_start_twice_cold_4();
LAB_001d2fc5:
    puStack_a0 = (uv_loop_t *)0x1d2fd4;
    run_test_timer_start_twice_cold_5();
  }
  puVar2 = (uv_loop_t *)local_88;
  puStack_a0 = (uv_loop_t *)twice_cb;
  run_test_timer_start_twice_cold_6();
  puStack_b8 = (uv_loop_t *)0x1d2fff;
  puStack_a0 = unaff_RBX;
  printf("TWICE_CB %d\n",(ulong)(uint)twice_cb_called);
  if (puVar2 == (uv_loop_t *)0x0) {
    puStack_b8 = (uv_loop_t *)0x1d3045;
    twice_cb_cold_2();
  }
  else {
    puStack_b8 = (uv_loop_t *)0x1d300c;
    iVar1 = uv_is_active((uv_handle_t *)puVar2);
    puStack_a8 = (uv__queue *)(long)iVar1;
    puStack_b0 = (uv_loop_t *)0x0;
    if (puStack_a8 == (uv__queue *)0x0) {
      twice_cb_called = twice_cb_called + 1;
      uv_close((uv_handle_t *)puVar2,twice_close_cb);
      return extraout_EAX;
    }
  }
  puStack_b8 = (uv_loop_t *)run_test_timer_init;
  twice_cb_cold_1();
  puStack_b8 = puVar2;
  puVar3 = uv_default_loop();
  iVar1 = uv_timer_init(puVar3,&uStack_130);
  if (iVar1 == 0) {
    uVar4 = uv_timer_get_repeat(&uStack_130);
    if (uVar4 != 0) goto LAB_001d3171;
    uv_timer_get_due_in(&uStack_130);
    iVar1 = uv_is_active((uv_handle_t *)&uStack_130);
    if (iVar1 != 0) goto LAB_001d318f;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_001d3171:
    run_test_timer_init_cold_2();
    run_test_timer_init_cold_5();
LAB_001d318f:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  puVar5 = auStack_260;
  auStack_250._4_4_ = 0;
  auStack_250._0_4_ = 1;
  pcStack_268 = (code *)0x1d31cc;
  puStack_158 = puVar2;
  puVar3 = uv_default_loop();
  pcStack_268 = (code *)0x1d31dc;
  iVar1 = uv_timer_init(puVar3,&uStack_1d0);
  uStack_248.data = (void *)(long)iVar1;
  auStack_260[0] = 0;
  if ((uv_loop_t *)uStack_248.data == (uv_loop_t *)0x0) {
    pcStack_268 = (code *)0x1d31ff;
    puVar3 = uv_default_loop();
    pcStack_268 = (code *)0x1d320c;
    iVar1 = uv_timer_init(puVar3,&uStack_248);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d347c;
    puVar2 = (uv_loop_t *)(auStack_250 + 4);
    pcStack_268 = (code *)0x1d324a;
    uStack_1d0.data = puVar2;
    iVar1 = uv_timer_start(&uStack_1d0,order_cb_a,0,0);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d3489;
    pcStack_268 = (code *)0x1d3285;
    uStack_248.data = (uv_loop_t *)auStack_250;
    iVar1 = uv_timer_start(&uStack_248,order_cb_b,0,0);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d3496;
    pcStack_268 = (code *)0x1d32a8;
    puVar3 = uv_default_loop();
    pcStack_268 = (code *)0x1d32b2;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d34a3;
    auStack_260[0] = 2;
    auStack_260[1] = SEXT48(order_cb_called);
    if ((__pthread_internal_list *)auStack_260[1] != (__pthread_internal_list *)0x2)
    goto LAB_001d34b0;
    pcStack_268 = (code *)0x1d3300;
    iVar1 = uv_timer_stop(&uStack_1d0);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d34bd;
    pcStack_268 = (code *)0x1d3328;
    iVar1 = uv_timer_stop(&uStack_248);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d34ca;
    order_cb_called = 0;
    pcStack_268 = (code *)0x1d3368;
    uStack_248.data = puVar2;
    iVar1 = uv_timer_start(&uStack_248,order_cb_b,0,0);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d34d7;
    pcStack_268 = (code *)0x1d33a1;
    uStack_1d0.data = (uv_loop_t *)auStack_250;
    iVar1 = uv_timer_start(&uStack_1d0,order_cb_a,0,0);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d34e4;
    pcStack_268 = (code *)0x1d33c4;
    puVar3 = uv_default_loop();
    pcStack_268 = (code *)0x1d33ce;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_260[0] = SEXT48(iVar1);
    auStack_260[1] = (__pthread_internal_list *)0x0;
    if (auStack_260[0] != 0) goto LAB_001d34f1;
    auStack_260[0] = 2;
    auStack_260[1] = SEXT48(order_cb_called);
    if ((__pthread_internal_list *)auStack_260[1] != (__pthread_internal_list *)0x2)
    goto LAB_001d34fe;
    pcStack_268 = (code *)0x1d3414;
    puVar2 = uv_default_loop();
    pcStack_268 = (code *)0x1d3428;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_268 = (code *)0x1d3432;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_260[0] = 0;
    pcStack_268 = (code *)0x1d343f;
    puVar3 = uv_default_loop();
    pcStack_268 = (code *)0x1d3447;
    iVar1 = uv_loop_close(puVar3);
    auStack_260[1] = SEXT48(iVar1);
    if (auStack_260[0] == auStack_260[1]) {
      pcStack_268 = (code *)0x1d3462;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x1d347c;
    run_test_timer_order_cold_1();
LAB_001d347c:
    pcStack_268 = (code *)0x1d3489;
    run_test_timer_order_cold_2();
LAB_001d3489:
    pcStack_268 = (code *)0x1d3496;
    run_test_timer_order_cold_3();
LAB_001d3496:
    pcStack_268 = (code *)0x1d34a3;
    run_test_timer_order_cold_4();
LAB_001d34a3:
    pcStack_268 = (code *)0x1d34b0;
    run_test_timer_order_cold_5();
LAB_001d34b0:
    pcStack_268 = (code *)0x1d34bd;
    run_test_timer_order_cold_6();
LAB_001d34bd:
    pcStack_268 = (code *)0x1d34ca;
    run_test_timer_order_cold_7();
LAB_001d34ca:
    pcStack_268 = (code *)0x1d34d7;
    run_test_timer_order_cold_8();
LAB_001d34d7:
    pcStack_268 = (code *)0x1d34e4;
    run_test_timer_order_cold_9();
LAB_001d34e4:
    pcStack_268 = (code *)0x1d34f1;
    run_test_timer_order_cold_10();
LAB_001d34f1:
    pcStack_268 = (code *)0x1d34fe;
    run_test_timer_order_cold_11();
LAB_001d34fe:
    pcStack_268 = (code *)0x1d350b;
    run_test_timer_order_cold_12();
  }
  pcStack_268 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_268 = (code *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  auStack_270 = (undefined1  [8])(long)*(int *)*puVar5;
  if ((undefined1  [8])pcStack_268 == auStack_270) {
    return iVar1;
  }
  ppcVar6 = &pcStack_268;
  puStack_280 = (uv__queue *)order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  puStack_280 = (uv__queue *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  puStack_288 = (uv__queue *)(long)*(int *)*ppcVar6;
  if (puStack_280 == puStack_288) {
    return iVar1;
  }
  puStack_298 = (uv_loop_t *)run_test_timer_zero_timeout;
  order_cb_b_cold_1();
  puStack_330 = (uv_loop_t *)0x1d35ad;
  puStack_298 = puVar2;
  puVar2 = uv_default_loop();
  puStack_330 = (uv_loop_t *)0x1d35bd;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(auStack_318 + 8));
  auStack_318 = (undefined1  [8])(long)iVar1;
  uStack_320 = (uv_handle_t *)0x0;
  if (auStack_318 == (undefined1  [8])0x0) {
    puStack_330 = (uv_loop_t *)0x1d35f2;
    iVar1 = uv_timer_start((uv_timer_t *)(auStack_318 + 8),zero_timeout_cb,0,0);
    auStack_318 = (undefined1  [8])(long)iVar1;
    uStack_320 = (uv_handle_t *)0x0;
    if (auStack_318 != (undefined1  [8])0x0) goto LAB_001d371a;
    auStack_318 = (undefined1  [8])0x1;
    puStack_330 = (uv_loop_t *)0x1d3625;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_320 = SEXT48(iVar1);
    if (auStack_318 != (undefined1  [8])uStack_320) goto LAB_001d3729;
    auStack_318 = (undefined1  [8])0x1;
    uStack_320 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_320 != (uv_handle_t *)0x1) goto LAB_001d3738;
    puStack_330 = (uv_loop_t *)0x1d366d;
    uv_close((uv_handle_t *)(auStack_318 + 8),(uv_close_cb)0x0);
    puStack_330 = (uv_loop_t *)0x1d3677;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_318 = (undefined1  [8])(long)iVar1;
    uStack_320 = (uv_handle_t *)0x0;
    if (auStack_318 != (undefined1  [8])0x0) goto LAB_001d3747;
    auStack_318 = (undefined1  [8])0x1;
    uStack_320 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_320 != (uv_handle_t *)0x1) goto LAB_001d3756;
    puStack_330 = (uv_loop_t *)0x1d36cd;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_330 = (uv_loop_t *)0x1d36d7;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_318 = (undefined1  [8])0x0;
    puStack_330 = (uv_loop_t *)0x1d36e8;
    iVar1 = uv_loop_close(puVar2);
    uStack_320 = SEXT48(iVar1);
    if (auStack_318 == (undefined1  [8])uStack_320) {
      puStack_330 = (uv_loop_t *)0x1d3700;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_330 = (uv_loop_t *)0x1d371a;
    run_test_timer_zero_timeout_cold_1();
LAB_001d371a:
    puStack_330 = (uv_loop_t *)0x1d3729;
    run_test_timer_zero_timeout_cold_2();
LAB_001d3729:
    puStack_330 = (uv_loop_t *)0x1d3738;
    run_test_timer_zero_timeout_cold_3();
LAB_001d3738:
    puStack_330 = (uv_loop_t *)0x1d3747;
    run_test_timer_zero_timeout_cold_4();
LAB_001d3747:
    puStack_330 = (uv_loop_t *)0x1d3756;
    run_test_timer_zero_timeout_cold_5();
LAB_001d3756:
    puStack_330 = (uv_loop_t *)0x1d3765;
    run_test_timer_zero_timeout_cold_6();
  }
  puVar3 = (uv_loop_t *)auStack_318;
  puStack_330 = (uv_loop_t *)zero_timeout_cb;
  run_test_timer_zero_timeout_cold_7();
  auStack_350._8_8_ = (uv_loop_t *)0x1d378c;
  puStack_330 = puVar2;
  iVar1 = uv_timer_start((uv_timer_t *)puVar3,zero_timeout_cb,0,0);
  p_Stack_338 = (uv_close_cb)(long)iVar1;
  auStack_350._16_8_ = (uv_handle_t *)0x0;
  if (p_Stack_338 == (uv_close_cb)0x0) {
    auStack_350._8_8_ = (uv_loop_t *)0x1d37af;
    uv_stop(*(uv_loop_t **)&puVar3->active_handles);
    zero_timeout_cb_calls = zero_timeout_cb_calls + 1;
    return extraout_EAX_00;
  }
  auStack_350._8_8_ = run_test_timer_huge_timeout;
  zero_timeout_cb_cold_1();
  uStack_360._0_4_ = 0x1d37d2;
  uStack_360._4_4_ = 0;
  auStack_350._8_8_ = puVar3;
  puVar2 = uv_default_loop();
  uStack_360._0_4_ = 0x1d37e1;
  uStack_360._4_4_ = 0;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  auStack_350._0_8_ = SEXT48(iVar1);
  puStack_358 = (uv__queue *)0x0;
  if ((uv__queue *)auStack_350._0_8_ == (uv__queue *)0x0) {
    uStack_360._0_4_ = 0x1d3804;
    uStack_360._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d3813;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d3a1e;
    uStack_360._0_4_ = 0x1d3836;
    uStack_360._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d3845;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_init(puVar2,&huge_timer2);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d3a2b;
    uStack_360._0_4_ = 0x1d387d;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d3a38;
    puVar3 = (uv_loop_t *)0xffffffffffff;
    uStack_360._0_4_ = 0x1d38bd;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d3a45;
    uStack_360._0_4_ = 0x1d38f7;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d3a52;
    auStack_350._0_8_ = (uv__queue *)0x1;
    uStack_360._0_4_ = 0x1d392a;
    uStack_360._4_4_ = 0;
    puStack_358 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if ((uv__queue *)auStack_350._0_8_ != puStack_358) goto LAB_001d3a5f;
    auStack_350._0_8_ = (uv__queue *)0xffffffffffff;
    uStack_360._0_4_ = 0x1d394e;
    uStack_360._4_4_ = 0;
    puStack_358 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if ((uv__queue *)auStack_350._0_8_ != puStack_358) goto LAB_001d3a6c;
    auStack_350._0_8_ = (uv__queue *)0x0;
    uStack_360._0_4_ = 0x1d3976;
    uStack_360._4_4_ = 0;
    puStack_358 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (puStack_358 < (ulong)auStack_350._0_8_) goto LAB_001d3a79;
    uStack_360._0_4_ = 0x1d398e;
    uStack_360._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d3998;
    uStack_360._4_4_ = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d3a86;
    uStack_360._0_4_ = 0x1d39bb;
    uStack_360._4_4_ = 0;
    puVar3 = uv_default_loop();
    uStack_360._0_4_ = 0x1d39cf;
    uStack_360._4_4_ = 0;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uStack_360._0_4_ = 0x1d39d9;
    uStack_360._4_4_ = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_350._0_8_ = (uv__queue *)0x0;
    uStack_360._0_4_ = 0x1d39e7;
    uStack_360._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d39ef;
    uStack_360._4_4_ = 0;
    iVar1 = uv_loop_close(puVar2);
    puStack_358 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)auStack_350._0_8_ == puStack_358) {
      uStack_360._0_4_ = 0x1d3a09;
      uStack_360._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_360._0_4_ = 0x1d3a1e;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d3a1e:
    uStack_360._0_4_ = 0x1d3a2b;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d3a2b:
    uStack_360._0_4_ = 0x1d3a38;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d3a38:
    uStack_360._0_4_ = 0x1d3a45;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d3a45:
    uStack_360._0_4_ = 0x1d3a52;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d3a52:
    uStack_360._0_4_ = 0x1d3a5f;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d3a5f:
    uStack_360._0_4_ = 0x1d3a6c;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d3a6c:
    uStack_360._0_4_ = 0x1d3a79;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d3a79:
    uStack_360._0_4_ = 0x1d3a86;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d3a86:
    uStack_360._0_4_ = 0x1d3a93;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar7 = (uv_timer_t *)auStack_350;
  uStack_360 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar7 == &tiny_timer) {
    auStack_370._8_8_ = (uv_loop_t *)0x1d3abb;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    auStack_370._8_8_ = (uv_loop_t *)0x1d3ac9;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  auStack_370._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_380 = (code *)0x1d3ae7;
  auStack_370._8_8_ = puVar3;
  puVar2 = uv_default_loop();
  pcStack_380 = (code *)0x1d3af6;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  auStack_370._0_8_ = SEXT48(iVar1);
  pvStack_378 = (void *)0x0;
  if ((void *)auStack_370._0_8_ == (void *)0x0) {
    pcStack_380 = (code *)0x1d3b19;
    puVar2 = uv_default_loop();
    pcStack_380 = (code *)0x1d3b28;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d3c4f;
    pcStack_380 = (code *)0x1d3b63;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d3c5c;
    pcStack_380 = (code *)0x1d3ba0;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d3c69;
    pcStack_380 = (code *)0x1d3bc3;
    puVar2 = uv_default_loop();
    pcStack_380 = (code *)0x1d3bcd;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d3c76;
    pcStack_380 = (code *)0x1d3bf0;
    puVar3 = uv_default_loop();
    pcStack_380 = (code *)0x1d3c04;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcStack_380 = (code *)0x1d3c0e;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_370._0_8_ = (void *)0x0;
    pcStack_380 = (code *)0x1d3c1c;
    puVar2 = uv_default_loop();
    pcStack_380 = (code *)0x1d3c24;
    iVar1 = uv_loop_close(puVar2);
    pvStack_378 = (void *)(long)iVar1;
    if ((void *)auStack_370._0_8_ == pvStack_378) {
      pcStack_380 = (code *)0x1d3c3a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_380 = (code *)0x1d3c4f;
    run_test_timer_huge_repeat_cold_1();
LAB_001d3c4f:
    pcStack_380 = (code *)0x1d3c5c;
    run_test_timer_huge_repeat_cold_2();
LAB_001d3c5c:
    pcStack_380 = (code *)0x1d3c69;
    run_test_timer_huge_repeat_cold_3();
LAB_001d3c69:
    pcStack_380 = (code *)0x1d3c76;
    run_test_timer_huge_repeat_cold_4();
LAB_001d3c76:
    pcStack_380 = (code *)0x1d3c83;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar7 = (uv_timer_t *)auStack_370;
  pcStack_380 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar7 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX_02;
    }
  }
  else {
    if (puVar7 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX_02;
      }
      puStack_388 = (uv_loop_t *)0x1d3cc2;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return extraout_EAX_03;
    }
    puStack_388 = (uv_loop_t *)0x1d3cee;
    huge_repeat_cb_cold_1();
  }
  puStack_388 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_388 = puVar3;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_400);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_400,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d3ef3;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001d3f02;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d3f11;
    iVar1 = uv_timer_start(&uStack_400,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d3f20;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001d3f2f;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d3f3e;
    uv_close((uv_handle_t *)&uStack_400,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d3f5c;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d3ef3:
    run_test_timer_run_once_cold_2();
LAB_001d3f02:
    run_test_timer_run_once_cold_3();
LAB_001d3f11:
    run_test_timer_run_once_cold_4();
LAB_001d3f20:
    run_test_timer_run_once_cold_5();
LAB_001d3f2f:
    run_test_timer_run_once_cold_6();
LAB_001d3f3e:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d3f5c:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_04;
}

Assistant:

TEST_IMPL(timer_start_twice) {
  uv_timer_t once;
  int r;

  r = uv_timer_init(uv_default_loop(), &once);
  ASSERT_OK(r);
  r = uv_timer_start(&once, never_cb, 86400 * 1000, 0);
  ASSERT_OK(r);
  r = uv_timer_start(&once, twice_cb, 10, 0);
  ASSERT_OK(r);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, twice_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}